

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,string *key,string *parent_key_information)

{
  SchnorrPubkey *this_00;
  bool bVar1;
  int iVar2;
  pointer puVar3;
  CfdException *this_01;
  long lVar4;
  pointer puVar5;
  ulong uVar6;
  size_t __n;
  ByteData bytes;
  string errmsg;
  SchnorrPubkey schnorr;
  string hdkey_top;
  ByteData local_168;
  undefined1 local_148 [40];
  pointer local_120;
  pointer puStack_118;
  pointer local_110;
  pointer local_108;
  pointer puStack_100;
  pointer local_f8;
  pointer local_f0;
  pointer puStack_e8;
  pointer local_e0;
  pointer local_d8;
  Privkey *local_d0;
  string *local_c8;
  string *local_c0;
  ByteData local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  ExtPubkey *local_80;
  ExtPrivkey *local_78;
  Pubkey *local_70;
  SchnorrPubkey local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(this_00);
  local_70 = &this->pubkey_;
  Pubkey::Pubkey(local_70);
  local_d0 = &this->privkey_;
  Privkey::Privkey(local_d0);
  local_78 = &this->extprivkey_;
  ExtPrivkey::ExtPrivkey(local_78);
  local_80 = &this->extpubkey_;
  ExtPubkey::ExtPubkey(local_80);
  local_88 = &(this->parent_info_).field_2;
  (this->parent_info_)._M_dataplus._M_p = (pointer)local_88;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  local_c0 = &this->path_;
  local_90 = &(this->path_).field_2;
  (this->path_)._M_dataplus._M_p = (pointer)local_90;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  local_c8 = (string *)&this->key_string_;
  local_98 = &(this->key_string_).field_2;
  (this->key_string_)._M_dataplus._M_p = (pointer)local_98;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  if (key->_M_string_length < 4) {
    this_01 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"DescriptorKeyInfo illegal key.","");
    CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::substr((ulong)local_50,(ulong)key);
  iVar2 = ::std::__cxx11::string::compare((char *)local_50);
  if ((iVar2 == 0) || (iVar2 = ::std::__cxx11::string::compare((char *)local_50), iVar2 == 0)) {
    puVar3 = local_148 + 0x10;
    local_148._0_8_ = puVar3;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"/","");
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_168,(string *)key,(string *)local_148);
    if ((pointer)local_148._0_8_ != puVar3) {
      operator_delete((void *)local_148._0_8_);
    }
    if (0x20 < (ulong)((long)local_168.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_168.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      uVar6 = 1;
      lVar4 = 0x20;
      do {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)
                                 local_168.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->_M_p + lVar4));
        ::std::__cxx11::string::_M_append((char *)local_c0,local_148._0_8_);
        if ((pointer)local_148._0_8_ != puVar3) {
          operator_delete((void *)local_148._0_8_);
        }
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar6 < (ulong)((long)local_168.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_168.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    iVar2 = ::std::__cxx11::string::compare((char *)local_50);
    if (iVar2 == 0) {
      this->key_type_ = kDescriptorKeyBip32Priv;
      ExtPrivkey::ExtPrivkey
                ((ExtPrivkey *)local_148,
                 (string *)
                 local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      puVar3 = (this->extprivkey_).serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
      (this->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
      (this->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_148._16_8_;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = (pointer)0x0;
      local_148._16_8_ = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      (this->extprivkey_).version_ = local_148._24_4_;
      (this->extprivkey_).fingerprint_ = local_148._28_4_;
      (this->extprivkey_).depth_ = local_148[0x20];
      *(undefined3 *)&(this->extprivkey_).field_0x21 = local_148._33_3_;
      (this->extprivkey_).child_num_ = local_148._36_4_;
      puVar3 = (this->extprivkey_).chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_120;
      (this->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_118;
      (this->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_110;
      local_120 = (pointer)0x0;
      puStack_118 = (pointer)0x0;
      local_110 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar3 = (this->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extprivkey_).privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_108;
      *(pointer *)
       ((long)&(this->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_100;
      *(pointer *)
       ((long)&(this->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_f8;
      local_108 = (pointer)0x0;
      puStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      *(pointer *)&(this->extprivkey_).privkey_.is_compressed_ = local_f0;
      puVar3 = (this->extprivkey_).tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puStack_e8;
      (this->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = local_e0;
      (this->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_d8;
      puStack_e8 = (pointer)0x0;
      local_e0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      puVar5 = puStack_e8;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        puVar5 = puStack_e8;
      }
    }
    else {
      this->key_type_ = kDescriptorKeyBip32;
      ExtPubkey::ExtPubkey
                ((ExtPubkey *)local_148,
                 (string *)
                 local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      puVar3 = (this->extpubkey_).serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_148._16_8_;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = (pointer)0x0;
      local_148._16_8_ = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      (this->extpubkey_).version_ = local_148._24_4_;
      (this->extpubkey_).fingerprint_ = local_148._28_4_;
      (this->extpubkey_).depth_ = local_148[0x20];
      *(undefined3 *)&(this->extpubkey_).field_0x21 = local_148._33_3_;
      (this->extpubkey_).child_num_ = local_148._36_4_;
      puVar3 = (this->extpubkey_).chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_120;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_118;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_110;
      local_120 = (pointer)0x0;
      puStack_118 = (pointer)0x0;
      local_110 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar3 = (this->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extpubkey_).pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_108;
      *(pointer *)
       ((long)&(this->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_100;
      *(pointer *)
       ((long)&(this->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_f8;
      local_108 = (pointer)0x0;
      puStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar3 = (this->extpubkey_).tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_f0;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_e8;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_e0;
      local_f0 = (pointer)0x0;
      puStack_e8 = (pointer)0x0;
      local_e0 = (pointer)0x0;
      puVar5 = local_f0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        puVar5 = local_f0;
      }
    }
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    if (local_108 != (pointer)0x0) {
      operator_delete(local_108);
    }
    if (local_120 != (pointer)0x0) {
      operator_delete(local_120);
    }
    if ((pointer)local_148._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._0_8_);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
  }
  else {
    this->key_type_ = kDescriptorKeyPublic;
    ByteData::ByteData(&local_168,key);
    bVar1 = Pubkey::IsValid(&local_168);
    if (bVar1) {
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = (long)local_168.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_168.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar6 == 0) {
        puVar3 = (pointer)0x0;
      }
      else {
        if ((long)uVar6 < 0) {
          ::std::__throw_bad_alloc();
        }
        puVar3 = (pointer)operator_new(uVar6);
      }
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar3 + uVar6;
      __n = (long)local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar3;
      if (__n != 0) {
        local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
        memmove(puVar3,local_168.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3 + __n;
      Pubkey::Pubkey((Pubkey *)local_148,&local_b8);
      puVar3 = (this->pubkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_148._16_8_;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = (pointer)0x0;
      local_148._16_8_ = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      if ((pointer)local_148._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._0_8_);
        local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
    }
    else {
      SchnorrPubkey::SchnorrPubkey(&local_68,&local_168);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
      SchnorrPubkey::GetHex_abi_cxx11_((string *)local_148,this_00);
      ::std::__cxx11::string::operator=(local_c8,(string *)local_148);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_);
      }
      this->key_type_ = kDescriptorKeySchnorr;
    }
    if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((string *)
        local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (string *)0x0) {
      operator_delete(local_168.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (parent_key_information->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const std::string& key, const std::string parent_key_information) {
  if (key.size() < 4) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "DescriptorKeyInfo illegal key.");
  }
  // analyze format
  std::string hdkey_top = key.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::vector<std::string> list = StringUtil::Split(key, "/");
    for (size_t index = 1; index < list.size(); ++index) {
      path_ += "/" + list[index];
    }
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
      extprivkey_ = ExtPrivkey(list[0]);
    } else {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
      extpubkey_ = ExtPubkey(list[0]);
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    try {
      // pubkey format check
      ByteData bytes(key);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey_ = Pubkey(bytes);
      } else {
        // schnorr pubkey
        SchnorrPubkey schnorr(bytes);
        schnorr_pubkey_ = schnorr;
        key_string_ = schnorr_pubkey_.GetHex();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (Privkey::HasWif(key)) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      Privkey privkey;
      // privkey WIF check
      try {
        privkey_ = Privkey::FromWif(key, NetType::kMainnet);
      } catch (const CfdException& except) {
        std::string errmsg(except.what());
        if (errmsg.find("Error WIF to Private key.") == std::string::npos) {
          throw except;
        }
      }
      if (!privkey_.IsValid()) {
        privkey_ = Privkey::FromWif(key, NetType::kTestnet);
      }
      key_string_ = privkey_.GetWif();
    }
  }

  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}